

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

void __thiscall Assimp::IFC::Curve::SampleDiscrete(Curve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t i;
  ulong uVar4;
  undefined1 auVar5 [16];
  double local_48;
  aiVector3t<double> local_40;
  ulong uVar3;
  
  bVar1 = InRange(this,a);
  if (!bVar1) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x24b,
                  "virtual void Assimp::IFC::Curve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  bVar1 = InRange(this,b);
  if (bVar1) {
    iVar2 = (*this->_vptr_Curve[6])(a,b,this);
    uVar3 = CONCAT44(extraout_var,iVar2);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&out->mVerts,
               uVar3 + ((long)(out->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(out->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1);
    auVar5._8_4_ = extraout_var;
    auVar5._0_8_ = uVar3;
    auVar5._12_4_ = 0x45300000;
    local_48 = a;
    for (uVar4 = 0; uVar4 <= uVar3; uVar4 = uVar4 + 1) {
      (*this->_vptr_Curve[3])(local_48,&local_40,this);
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)out,&local_40);
      local_48 = local_48 +
                 (b - a) / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0));
    }
    return;
  }
  __assert_fail("InRange( b )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x24c,
                "virtual void Assimp::IFC::Curve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
               );
}

Assistant:

void Curve::SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
    ai_assert( InRange( a ) );
    ai_assert( InRange( b ) );

    const size_t cnt = std::max(static_cast<size_t>(0),EstimateSampleCount(a,b));
    out.mVerts.reserve( out.mVerts.size() + cnt + 1);

    IfcFloat p = a, delta = (b-a)/cnt;
    for(size_t i = 0; i <= cnt; ++i, p += delta) {
        out.mVerts.push_back(Eval(p));
    }
}